

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O0

void testDefaultHelp_ClearHelpText_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  string answer;
  stringstream ss;
  Argengine ae;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd58;
  allocator<char> *in_stack_fffffffffffffd60;
  allocator<char> *__a;
  iterator in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  stringstream local_1f8 [395];
  undefined1 local_6d;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  size_type local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_6d = 1;
  local_58 = &local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  local_6d = 0;
  local_30 = &local_50;
  local_28 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1088f4);
  __l._M_len = (size_type)in_stack_fffffffffffffd70;
  __l._M_array = in_stack_fffffffffffffd68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd60,__l,in_stack_fffffffffffffd58);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd40);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10894e);
  this = &local_50;
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_288 = local_288 + -1;
    std::__cxx11::string::~string((string *)local_288);
  } while (local_288 != this);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::stringstream::stringstream(local_1f8);
  juzzlin::Argengine::setOutputStream((ostream *)local_8);
  __a = &local_219;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)local_288,__a);
  juzzlin::Argengine::setHelpText(local_8,local_218);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  juzzlin::Argengine::printHelp();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)local_288,__a);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if (!_Var1) {
    __assert_fail("ss.str() == answer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                  ,0x57,"void testDefaultHelp_ClearHelpText_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testDefaultHelp_ClearHelpText_ShouldSucceed()
{
    Argengine ae({ "test" });
    std::stringstream ss;
    ae.setOutputStream(ss);
    ae.setHelpText("");
    ae.printHelp();
    const std::string answer = "Options:\n\n"
                               "-h, --help  Show this help.\n\n";
    assert(ss.str() == answer);
}